

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qeglfskmsdevice.cpp
# Opt level: O0

void __thiscall
QEglFSKmsDevice::registerScreen
          (QEglFSKmsDevice *this,QPlatformScreen *screen,bool isPrimary,QPoint *virtualPos,
          QList<QPlatformScreen_*> *virtualSiblings)

{
  long lVar1;
  QPoint *in_RCX;
  byte in_DL;
  QEglFSKmsScreen *in_RSI;
  long in_FS_OFFSET;
  QEglFSKmsScreen *s;
  QList<QPlatformScreen_*> *in_stack_ffffffffffffff98;
  QEglFSKmsScreen *this_00;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  QEglFSKmsScreen::setVirtualPosition(in_RSI,in_RCX);
  this_00 = in_RSI;
  QList<QPlatformScreen_*>::QList((QList<QPlatformScreen_*> *)in_RSI,in_stack_ffffffffffffff98);
  QEglFSKmsScreen::setVirtualSiblings(this_00,in_stack_ffffffffffffff98);
  QList<QPlatformScreen_*>::~QList((QList<QPlatformScreen_*> *)0x109a92);
  QWindowSystemInterface::handleScreenAdded((QPlatformScreen *)in_RSI,(bool)(in_DL & 1));
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QEglFSKmsDevice::registerScreen(QPlatformScreen *screen,
                                     bool isPrimary,
                                     const QPoint &virtualPos,
                                     const QList<QPlatformScreen *> &virtualSiblings)
{
    QEglFSKmsScreen *s = static_cast<QEglFSKmsScreen *>(screen);
    s->setVirtualPosition(virtualPos);
    s->setVirtualSiblings(virtualSiblings);
    QWindowSystemInterface::handleScreenAdded(s, isPrimary);
}